

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::selectTwinHalfedge(Scene *this)

{
  Halfedge *pHVar1;
  HalfedgeIter *pHVar2;
  Halfedge *h;
  Scene *this_local;
  
  if (((this->selected).element != (HalfedgeElement *)0x0) &&
     (pHVar1 = HalfedgeElement::getHalfedge((this->selected).element), pHVar1 != (Halfedge *)0x0)) {
    pHVar2 = Halfedge::twin(pHVar1);
    pHVar1 = elementAddress(pHVar2->_M_node);
    (this->selected).element = &pHVar1->super_HalfedgeElement;
  }
  return;
}

Assistant:

void Scene::selectTwinHalfedge()
{
   if( selected.element )
   {
      Halfedge* h = selected.element->getHalfedge();
      if( h )
      {
         selected.element = elementAddress( h->twin() );
      }
   }
}